

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O0

void __thiscall
webfront::http::std::experimental::net::v1::
basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
::~basic_io_object(basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
                   *this)

{
  resolver_service_base *in_RDI;
  implementation_type *in_stack_ffffffffffffffe8;
  
  detail::resolver_service_base::destroy(in_RDI,in_stack_ffffffffffffffe8);
  shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x137883);
  return;
}

Assistant:

~basic_io_object()
  {
    service_->destroy(implementation_);
  }